

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall Instance::enforceBoundaryConstraints(Instance *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ast local_40;
  
  iVar2 = Z3_ast_vector_size(((this->borderVars).super_object.m_ctx)->m_ctx,
                             (this->borderVars).m_vector);
  if (iVar2 != 0) {
    uVar4 = 0;
    do {
      bVar1 = Graph::isBoundary(&this->graph,(int)uVar4);
      if (bVar1) {
        z3::ast_vector_tpl<z3::expr>::operator[]
                  ((ast_vector_tpl<z3::expr> *)&local_40,(int)this + 0x170);
        z3::optimize::add(&this->solver,(expr *)&local_40);
        z3::ast::~ast(&local_40);
      }
      uVar4 = uVar4 + 1;
      uVar3 = Z3_ast_vector_size(((this->borderVars).super_object.m_ctx)->m_ctx,
                                 (this->borderVars).m_vector);
    } while (uVar4 < uVar3);
  }
  return;
}

Assistant:

void Instance::enforceBoundaryConstraints() {
  for (size_t vertex = 0; vertex < borderVars.size(); vertex++) {
    if (graph.isBoundary(vertex)) {
      solver.add(borderVars[vertex]);
    }
  }
}